

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lanli.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char **ppcVar2;
  FILE *__stream;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  undefined8 uVar10;
  clock_t cVar11;
  clock_t cVar12;
  uint uVar13;
  undefined *puVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  size_t local_e0;
  int local_d8;
  int local_d4;
  ulong local_d0;
  option_data local_c8;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  char **local_58;
  ulong local_50;
  char *local_48;
  FILE *local_40;
  char *local_38;
  
  uVar18 = (ulong)(uint)argc;
  local_40 = _stdin;
  local_c8.basename = *argv;
  local_c8.done = 0;
  local_c8.show_time = 0;
  local_c8.iunit = 0x400;
  local_c8.ounit = 0x40;
  local_c8.filename = (char *)0x0;
  local_c8.callback = CALLBACK_STRICT_POST;
  local_c8.flags = LANLI_FLAG_COMMENTS_SKIP|LANLI_FLAG_COMMENTS_PARSE;
  local_50 = 0;
  local_c8.levels = 0;
  local_c8.max_nesting = 0x10;
  local_c8.max_attributes = 8;
  iVar7 = 1;
  local_d0 = uVar18;
  local_58 = argv;
  do {
    iVar4 = (int)uVar18;
    if (iVar4 <= iVar7) goto LAB_00102915;
    pcVar15 = local_58[iVar7];
    if ((*pcVar15 == '-') && (pcVar15[1] != '\0')) {
      iVar5 = iVar7 + 1;
      if (iVar5 < iVar4) {
        pcVar17 = local_58[iVar5];
      }
      else {
        pcVar17 = (char *)0x0;
      }
      if (pcVar15[1] == '-') {
        if (pcVar15[2] == '\0') {
          uVar13 = 3;
          uVar18 = local_d0;
          iVar7 = iVar5;
        }
        else {
          if (pcVar17 == (char *)0x0) {
            bVar19 = false;
          }
          else {
            iVar4 = parseint(pcVar17,(long *)&local_e0);
            bVar19 = iVar4 != 0;
          }
          pcVar15 = pcVar15 + 2;
          iVar4 = strcmp(pcVar15,"help");
          uVar18 = local_d0;
          if (iVar4 == 0) {
            print_help(local_c8.basename);
LAB_001027b8:
            local_c8.done = 1;
LAB_001027c3:
            iVar4 = 0;
            uVar13 = 1;
          }
          else {
            iVar4 = strcmp(pcVar15,"version");
            if (iVar4 == 0) {
              puts("Built with Lanli 0.0.1.");
              goto LAB_001027b8;
            }
            iVar4 = strcmp(pcVar15,"time");
            if (iVar4 != 0) {
              iVar4 = strcmp(pcVar15,"levels");
              if ((bool)(iVar4 == 0 & bVar19)) {
                local_c8.levels = local_e0;
LAB_00102874:
                iVar4 = 2;
                goto LAB_0010287a;
              }
              iVar4 = strcmp(pcVar15,"max-nesting");
              if ((bool)(iVar4 == 0 & bVar19)) {
                local_c8.max_nesting = local_e0;
                goto LAB_00102874;
              }
              iVar4 = strcmp(pcVar15,"max-attributes");
              if ((bool)(iVar4 == 0 & bVar19)) {
                local_c8.max_attributes = local_e0;
                goto LAB_00102874;
              }
              iVar4 = strcmp(pcVar15,"input-unit");
              if ((bool)(iVar4 == 0 & bVar19)) {
                local_c8.iunit = local_e0;
                goto LAB_00102874;
              }
              iVar4 = strcmp(pcVar15,"output-unit");
              if ((bool)(iVar4 == 0 & bVar19)) {
                local_c8.ounit = local_e0;
                goto LAB_00102874;
              }
              lVar16 = 8;
              do {
                iVar5 = strcmp(pcVar15,*(char **)((long)&callbacks_info[0].callback + lVar16));
                if (iVar5 == 0) {
                  local_c8.callback =
                       *(undefined4 *)((long)&__do_global_dtors_aux_fini_array_entry + lVar16);
                  break;
                }
                lVar16 = lVar16 + 0x18;
              } while (lVar16 != 0x98);
              iVar4 = 1;
              uVar13 = 0;
              if (iVar5 == 0) goto LAB_0010287c;
              iVar5 = parse_flag_option(pcVar15,&local_c8);
              if ((iVar5 != 0) || (iVar5 = parse_negative_option(pcVar15,&local_c8), iVar5 != 0))
              goto LAB_0010287c;
              fprintf(_stderr,"Wrong option \'--%s\' found.\n",pcVar15);
              goto LAB_001027c3;
            }
            local_c8.show_time = 1;
            iVar4 = 1;
LAB_0010287a:
            uVar13 = 0;
          }
LAB_0010287c:
          iVar7 = iVar7 + iVar4;
        }
      }
      else {
        local_d4 = local_c8.show_time;
        local_d8 = local_c8.done;
        local_80 = local_c8.ounit;
        local_78 = local_c8.iunit;
        local_70 = local_c8.max_attributes;
        local_68 = local_c8.max_nesting;
        local_60 = local_c8.levels;
        local_38 = local_c8.basename;
        pcVar15 = pcVar15 + 2;
        local_48 = pcVar17;
        do {
          cVar1 = pcVar15[-1];
          if ((int)cVar1 == 0) goto LAB_0010267c;
          pcVar17 = local_48;
          if (*pcVar15 != '\0') {
            pcVar17 = pcVar15;
          }
          if (pcVar17 == (char *)0x0) {
            bVar19 = false;
          }
          else {
            iVar4 = parseint(pcVar17,(long *)&local_e0);
            bVar19 = iVar4 != 0;
          }
          uVar13 = 1;
          if (cVar1 == 'T') {
            local_d4 = 1;
            iVar4 = 1;
          }
          else {
            if (cVar1 == 'v') {
              puts("Built with Lanli 0.0.1.");
            }
            else {
              if (cVar1 != 'h') {
                if ((bool)(cVar1 == 'l' & bVar19)) {
                  iVar4 = 2;
                  local_60 = local_e0;
                }
                else if ((bool)(cVar1 == 'n' & bVar19)) {
                  iVar4 = 2;
                  local_68 = local_e0;
                }
                else if ((bool)(cVar1 == 'a' & bVar19)) {
                  iVar4 = 2;
                  local_70 = local_e0;
                }
                else if ((bool)(cVar1 == 'i' & bVar19)) {
                  iVar4 = 2;
                  local_78 = local_e0;
                }
                else if ((bool)(cVar1 == 'o' & bVar19)) {
                  iVar4 = 2;
                  local_80 = local_e0;
                }
                else {
                  iVar4 = 0;
                  fprintf(_stderr,"Wrong option \'-%c\' found.\n",(ulong)(uint)(int)cVar1);
                }
                goto LAB_00102612;
              }
              print_help(local_38);
            }
            iVar4 = 0;
            local_d8 = 1;
          }
LAB_00102612:
          if (iVar4 != 0) {
            if (iVar4 == 2) {
              iVar7 = iVar7 + (uint)(pcVar17 == local_48);
              uVar13 = 4;
            }
            else {
              uVar13 = 0;
            }
          }
          pcVar15 = pcVar15 + 1;
        } while (uVar13 == 0);
        if (uVar13 == 4) {
LAB_0010267c:
          local_c8.levels = local_60;
          local_c8.max_nesting = local_68;
          local_c8.max_attributes = local_70;
          local_c8.iunit = local_78;
          local_c8.ounit = local_80;
          local_c8.show_time = local_d4;
          local_c8.done = local_d8;
          uVar13 = 0;
          uVar18 = local_d0;
          iVar7 = iVar7 + 1;
        }
        else {
          local_c8.show_time = local_d4;
          local_c8.done = local_d8;
          local_c8.ounit = local_80;
          local_c8.iunit = local_78;
          local_c8.max_attributes = local_70;
          local_c8.max_nesting = local_68;
          local_c8.levels = local_60;
          uVar18 = local_d0;
        }
      }
    }
    else {
      iVar4 = (int)local_50;
      uVar3 = parse_argument(iVar4,pcVar15,0,&local_c8);
      uVar13 = uVar3 ^ 1;
      iVar7 = iVar7 + uVar3;
      local_50 = (ulong)(iVar4 + 1);
    }
    iVar4 = (int)uVar18;
  } while (uVar13 == 0);
  if (uVar13 == 3) {
LAB_00102915:
    ppcVar2 = local_58;
    if (iVar7 < iVar4) {
      iVar5 = (int)local_50;
      lVar16 = 0;
      do {
        iVar6 = parse_argument(iVar5 + (int)lVar16,ppcVar2[iVar7 + lVar16],1,&local_c8);
        bVar19 = iVar6 == 0;
        if (bVar19) break;
        lVar16 = lVar16 + 1;
      } while (iVar4 - iVar7 != (int)lVar16);
    }
    else {
      bVar19 = false;
    }
  }
  else {
    bVar19 = true;
  }
  if (local_c8.done != 0 || bVar19) {
    uVar3 = (uint)(local_c8.done == 0);
  }
  else {
    if ((local_c8.filename == (char *)0x0) ||
       (local_40 = fopen(local_c8.filename,"r"), local_40 != (FILE *)0x0)) {
      puVar8 = (undefined8 *)lanli_buffer_new(local_c8.iunit);
      __stream = local_40;
      iVar7 = lanli_buffer_putf(puVar8,local_40);
      if (iVar7 == 0) {
        if (__stream != _stdin) {
          fclose(__stream);
        }
        if ((local_c8._40_8_ & 0xffffffff) < 6) {
          puVar14 = (&PTR_lanli_callback_strict_post_00104d90)[local_c8._40_8_ & 0xffffffff];
        }
        else {
          puVar14 = (undefined *)0x0;
        }
        plVar9 = (long *)lanli_buffer_new(local_c8.ounit);
        uVar10 = lanli_document_new(puVar14,0,local_c8.flags,local_c8.levels,local_c8.max_nesting,
                                    local_c8.max_attributes);
        cVar11 = clock();
        lanli_document_render(uVar10,plVar9,*puVar8,puVar8[1]);
        cVar12 = clock();
        lanli_buffer_free(puVar8);
        lanli_document_free(uVar10);
        if ((plVar9[1] != 0) && (*(char *)(*plVar9 + -1 + plVar9[1]) != '\n')) {
          lanli_buffer_putc(plVar9,10);
        }
        fwrite((void *)*plVar9,1,plVar9[1],_stdout);
        lanli_buffer_free(plVar9);
        iVar7 = ferror(_stdout);
        if (iVar7 == 0) {
          if (local_c8.show_time == 0) {
            return 0;
          }
          if (cVar12 == -1 || cVar11 == -1) {
            main_cold_4();
            return 1;
          }
          dVar20 = (double)(cVar12 - cVar11) / 1000000.0;
          if (1.0 <= dVar20) {
            pcVar15 = "Time spent on rendering: %6.3f s.\n";
          }
          else {
            dVar20 = dVar20 * 1000.0;
            pcVar15 = "Time spent on rendering: %7.2f ms.\n";
          }
          fprintf(_stderr,pcVar15,dVar20);
          return 0;
        }
        main_cold_3();
      }
      else {
        main_cold_2();
      }
    }
    else {
      main_cold_1();
    }
    uVar3 = 5;
  }
  return uVar3;
}

Assistant:

int main(int argc, char **argv) {
  struct option_data data;
  clock_t t1, t2;
  FILE *file = stdin;
  lanli_buffer *ib, *ob;
  lanli_callback callback = NULL;
  void *opaque = NULL;
  lanli_document *document;

  /* Parse options */
  data.basename = argv[0];
  data.done = 0;
  data.show_time = 0;
  data.iunit = DEF_IUNIT;
  data.ounit = DEF_OUNIT;
  data.filename = NULL;
  data.callback = DEF_CALLBACK;
  data.flags = DEF_FLAGS;
  data.levels = DEF_LEVELS;
  data.max_nesting = DEF_MAX_NESTING;
  data.max_attributes = DEF_MAX_ATTRIBUTES;

  argc = parse_options(argc, argv, parse_short_option, parse_long_option, parse_argument, &data);
  if (data.done) return 0;
  if (!argc) return 1;

  /* Open input file, if needed */
  if (data.filename) {
    file = fopen(data.filename, "r");
    if (!file) {
      fprintf(stderr, "Unable to open input file \"%s\": %s\n", data.filename, strerror(errno));
      return 5;
    }
  }

  /* Read everything */
  ib = lanli_buffer_new(data.iunit);

  if (lanli_buffer_putf(ib, file)) {
    fprintf(stderr, "I/O errors found while reading input.\n");
    return 5;
  }

  if (file != stdin) fclose(file);

  /* Obtain the callback */
  switch (data.callback) {
    case CALLBACK_STRICT_POST:
      callback = lanli_callback_strict_post;
      break;
    case CALLBACK_ACCEPT:
      callback = callback_accept;
      break;
    case CALLBACK_ESCAPE:
      callback = callback_escape;
      break;
    case CALLBACK_SKIP:
      callback = callback_skip;
      break;
    case CALLBACK_IGNORE:
      callback = callback_ignore;
      break;
    case CALLBACK_VERBATIM:
      callback = callback_verbatim;
      break;
  };

  /* Sanitize input HTML */
  ob = lanli_buffer_new(data.ounit);
  document = lanli_document_new(callback, opaque, data.flags, data.levels, data.max_nesting, data.max_attributes);

  t1 = clock();
  lanli_document_render(document, ob, ib->data, ib->size);
  t2 = clock();

  /* Cleanup */
  lanli_buffer_free(ib);
  lanli_document_free(document);

  /* Write the result to stdout */
  if (ob->size && ob->data[ob->size-1] != '\n')
    lanli_buffer_putc(ob, '\n');

  (void)fwrite(ob->data, 1, ob->size, stdout);
  lanli_buffer_free(ob);

  if (ferror(stdout)) {
    fprintf(stderr, "I/O errors found while writing output.\n");
    return 5;
  }

  /* Show rendering time */
  if (data.show_time) {
    if (t1 == -1 || t2 == -1) {
      fprintf(stderr, "Failed to get the time.\n");
      return 1;
    }

    double elapsed = (double)(t2 - t1) / CLOCKS_PER_SEC;
    if (elapsed < 1)
      fprintf(stderr, "Time spent on rendering: %7.2f ms.\n", elapsed*1e3);
    else
      fprintf(stderr, "Time spent on rendering: %6.3f s.\n", elapsed);
  }

  return 0;
}